

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O0

FT_Error tt_face_load_cpal(TT_Face face,FT_Stream stream)

{
  ushort uVar1;
  unsigned_long uVar2;
  FT_Error FVar3;
  Cpal *pCVar4;
  FT_UShort *pFVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined2 *puVar9;
  FT_Stream_IoFunc p_Var10;
  FT_Memory pFVar11;
  FT_Stream_IoFunc local_88;
  FT_UShort *q;
  FT_UShort *limit;
  FT_UShort *array;
  FT_ULong entry_label_offset;
  FT_ULong label_offset;
  FT_ULong type_offset;
  FT_ULong table_size;
  FT_ULong colors_offset;
  Cpal *cpal;
  FT_Byte *p;
  FT_Byte *table;
  FT_Memory memory;
  FT_Stream pFStack_20;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  table = (FT_Byte *)(face->root).memory;
  p = (FT_Byte *)0x0;
  cpal = (Cpal *)0x0;
  colors_offset = 0;
  pFStack_20 = stream;
  stream_local = (FT_Stream)face;
  memory._4_4_ = (*face->goto_table)(face,0x4350414c,stream,&type_offset);
  if (memory._4_4_ != 0) goto LAB_0032f2a1;
  pCVar4 = cpal;
  if (type_offset < 0xc) goto LAB_0032f29a;
  memory._4_4_ = FT_Stream_ExtractFrame(pFStack_20,type_offset,&p);
  if (memory._4_4_ != 0) goto LAB_0032f2a1;
  cpal = (Cpal *)p;
  colors_offset = (FT_ULong)ft_mem_alloc((FT_Memory)table,0x28,(FT_Error *)((long)&memory + 4));
  if (memory._4_4_ != 0) goto LAB_0032f2a1;
  *(ushort *)colors_offset = CONCAT11((char)cpal->version,*(undefined1 *)((long)&cpal->version + 1))
  ;
  pCVar4 = (Cpal *)&cpal->num_colors;
  if (*(ushort *)colors_offset < 2) {
    *(ushort *)&stream_local[0xd].pathname =
         CONCAT11((char)cpal->num_colors,*(undefined1 *)((long)&cpal->num_colors + 1));
    *(ushort *)&stream_local[0xd].size = CONCAT11(cpal->field_0x4,cpal->field_0x5);
    *(ushort *)(colors_offset + 2) = CONCAT11(cpal->field_0x6,cpal->field_0x7);
    pCVar4 = (Cpal *)((long)&cpal->colors + 4);
    table_size = (FT_ULong)
                 ((uint)*(byte *)&cpal->colors << 0x18 |
                  (uint)*(byte *)((long)&cpal->colors + 1) << 0x10 |
                  (uint)*(byte *)((long)&cpal->colors + 2) << 8 |
                 (uint)*(byte *)((long)&cpal->colors + 3));
    if (((((uint)(ushort)stream_local[0xd].size * 2 + 0xc <= type_offset) &&
         (table_size < type_offset)) &&
        ((ulong)*(ushort *)(colors_offset + 2) << 2 <= type_offset - table_size)) &&
       (*(ushort *)&stream_local[0xd].pathname <= *(ushort *)(colors_offset + 2))) {
      *(Cpal **)(colors_offset + 0x10) = pCVar4;
      *(FT_Byte **)(colors_offset + 8) = p + table_size;
      cpal = pCVar4;
      if (*(ushort *)colors_offset == 1) {
        if (type_offset < (uint)(ushort)stream_local[0xd].size * 2 + 0x18) goto LAB_0032f29a;
        pFVar5 = &pCVar4->version + (ushort)stream_local[0xd].size;
        uVar6 = (ulong)((uint)(byte)*pFVar5 << 0x18 | (uint)*(byte *)((long)pFVar5 + 1) << 0x10 |
                        (uint)(byte)pFVar5[1] << 8 | (uint)*(byte *)((long)pFVar5 + 3));
        uVar7 = (ulong)((uint)*(byte *)(pFVar5 + 2) << 0x18 |
                        (uint)*(byte *)((long)pFVar5 + 5) << 0x10 | (uint)*(byte *)(pFVar5 + 3) << 8
                       | (uint)*(byte *)((long)pFVar5 + 7));
        cpal = (Cpal *)(pFVar5 + 6);
        uVar8 = (ulong)((uint)*(byte *)(pFVar5 + 4) << 0x18 |
                        (uint)*(byte *)((long)pFVar5 + 9) << 0x10 | (uint)*(byte *)(pFVar5 + 5) << 8
                       | (uint)*(byte *)((long)pFVar5 + 0xb));
        if (uVar6 != 0) {
          pCVar4 = cpal;
          if ((type_offset <= uVar6) ||
             (type_offset - uVar6 < (ulong)(ushort)stream_local[0xd].size << 1)) goto LAB_0032f29a;
          puVar9 = (undefined2 *)
                   ft_mem_qrealloc((FT_Memory)table,2,0,(ulong)(ushort)stream_local[0xd].size,
                                   (void *)0x0,(FT_Error *)((long)&memory + 4));
          if (memory._4_4_ != 0) goto LAB_0032f2a1;
          uVar2 = stream_local[0xd].size;
          local_88 = (FT_Stream_IoFunc)puVar9;
          cpal = (Cpal *)(p + uVar6);
          while (local_88 < puVar9 + (int)(uint)(ushort)uVar2) {
            *(ushort *)local_88 =
                 CONCAT11((char)cpal->version,*(undefined1 *)((long)&cpal->version + 1));
            local_88 = (FT_Stream_IoFunc)((long)local_88 + 2);
            cpal = (Cpal *)&cpal->num_colors;
          }
          stream_local[0xd].descriptor.pointer = puVar9;
        }
        if (uVar7 != 0) {
          pCVar4 = cpal;
          if ((type_offset <= uVar7) ||
             (type_offset - uVar7 < (ulong)(ushort)stream_local[0xd].size << 1)) goto LAB_0032f29a;
          puVar9 = (undefined2 *)
                   ft_mem_qrealloc((FT_Memory)table,2,0,(ulong)(ushort)stream_local[0xd].size,
                                   (void *)0x0,(FT_Error *)((long)&memory + 4));
          if (memory._4_4_ != 0) goto LAB_0032f2a1;
          uVar2 = stream_local[0xd].size;
          local_88 = (FT_Stream_IoFunc)puVar9;
          cpal = (Cpal *)(p + uVar7);
          while (local_88 < puVar9 + (int)(uint)(ushort)uVar2) {
            *(ushort *)local_88 =
                 CONCAT11((char)cpal->version,*(undefined1 *)((long)&cpal->version + 1));
            local_88 = (FT_Stream_IoFunc)((long)local_88 + 2);
            cpal = (Cpal *)&cpal->num_colors;
          }
          stream_local[0xd].pos = (unsigned_long)puVar9;
        }
        if (uVar8 != 0) {
          pCVar4 = cpal;
          if ((type_offset <= uVar8) ||
             (type_offset - uVar8 < (ulong)*(ushort *)&stream_local[0xd].pathname << 1))
          goto LAB_0032f29a;
          p_Var10 = (FT_Stream_IoFunc)
                    ft_mem_qrealloc((FT_Memory)table,2,0,
                                    (ulong)*(ushort *)&stream_local[0xd].pathname,(void *)0x0,
                                    (FT_Error *)((long)&memory + 4));
          if (memory._4_4_ != 0) goto LAB_0032f2a1;
          uVar1 = *(ushort *)&stream_local[0xd].pathname;
          local_88 = p_Var10;
          cpal = (Cpal *)(p + uVar8);
          while (local_88 < p_Var10 + (long)(int)(uint)uVar1 * 2) {
            *(ushort *)local_88 =
                 CONCAT11((char)cpal->version,*(undefined1 *)((long)&cpal->version + 1));
            local_88 = local_88 + 2;
            cpal = (Cpal *)&cpal->num_colors;
          }
          stream_local[0xd].read = p_Var10;
        }
      }
      *(FT_Byte **)(colors_offset + 0x18) = p;
      *(FT_ULong *)(colors_offset + 0x20) = type_offset;
      stream_local[0x12].pos = colors_offset;
      pFVar11 = (FT_Memory)
                ft_mem_realloc((FT_Memory)table,4,0,(ulong)*(ushort *)&stream_local[0xd].pathname,
                               (void *)0x0,(FT_Error *)((long)&memory + 4));
      stream_local[0xd].memory = pFVar11;
      if (memory._4_4_ != 0) goto LAB_0032f2a1;
      FVar3 = tt_face_palette_set((TT_Face)stream_local,0);
      pCVar4 = cpal;
      if (FVar3 == 0) {
        return 0;
      }
    }
  }
LAB_0032f29a:
  cpal = pCVar4;
  memory._4_4_ = 8;
LAB_0032f2a1:
  FT_Stream_ReleaseFrame(pFStack_20,&p);
  ft_mem_free((FT_Memory)table,(void *)colors_offset);
  stream_local[0x12].pos = 0;
  return memory._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cpal( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = face->root.memory;

    FT_Byte*  table = NULL;
    FT_Byte*  p     = NULL;

    Cpal*  cpal = NULL;

    FT_ULong  colors_offset;
    FT_ULong  table_size;


    error = face->goto_table( face, TTAG_CPAL, stream, &table_size );
    if ( error )
      goto NoCpal;

    if ( table_size < CPAL_V0_HEADER_BASE_SIZE )
      goto InvalidTable;

    if ( FT_FRAME_EXTRACT( table_size, table ) )
      goto NoCpal;

    p = table;

    if ( FT_NEW( cpal ) )
      goto NoCpal;

    cpal->version = FT_NEXT_USHORT( p );
    if ( cpal->version > 1 )
      goto InvalidTable;

    face->palette_data.num_palette_entries = FT_NEXT_USHORT( p );
    face->palette_data.num_palettes        = FT_NEXT_USHORT( p );

    cpal->num_colors = FT_NEXT_USHORT( p );
    colors_offset    = FT_NEXT_ULONG( p );

    if ( CPAL_V0_HEADER_BASE_SIZE             +
         face->palette_data.num_palettes * 2U > table_size )
      goto InvalidTable;

    if ( colors_offset >= table_size )
      goto InvalidTable;
    if ( cpal->num_colors * COLOR_SIZE > table_size - colors_offset )
      goto InvalidTable;

    if ( face->palette_data.num_palette_entries > cpal->num_colors )
      goto InvalidTable;

    cpal->color_indices = p;
    cpal->colors        = (FT_Byte*)( table + colors_offset );

    if ( cpal->version == 1 )
    {
      FT_ULong    type_offset, label_offset, entry_label_offset;
      FT_UShort*  array = NULL;
      FT_UShort*  limit;
      FT_UShort*  q;


      if ( CPAL_V0_HEADER_BASE_SIZE             +
           face->palette_data.num_palettes * 2U +
           3U * 4                               > table_size )
        goto InvalidTable;

      p += face->palette_data.num_palettes * 2U;

      type_offset        = FT_NEXT_ULONG( p );
      label_offset       = FT_NEXT_ULONG( p );
      entry_label_offset = FT_NEXT_ULONG( p );

      if ( type_offset )
      {
        if ( type_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - type_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + type_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_flags = array;
      }

      if ( label_offset )
      {
        if ( label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + label_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_name_ids = array;
      }

      if ( entry_label_offset )
      {
        if ( entry_label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palette_entries * 2U >
               table_size - entry_label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palette_entries ) )
          goto NoCpal;

        p     = table + entry_label_offset;
        q     = array;
        limit = q + face->palette_data.num_palette_entries;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_entry_name_ids = array;
      }
    }

    cpal->table      = table;
    cpal->table_size = table_size;

    face->cpal = cpal;

    /* set up default palette */
    if ( FT_NEW_ARRAY( face->palette,
                       face->palette_data.num_palette_entries ) )
      goto NoCpal;

    if ( tt_face_palette_set( face, 0 ) )
      goto InvalidTable;

    return FT_Err_Ok;

  InvalidTable:
    error = FT_THROW( Invalid_Table );

  NoCpal:
    FT_FRAME_RELEASE( table );
    FT_FREE( cpal );

    face->cpal = NULL;

    /* arrays in `face->palette_data' and `face->palette' */
    /* are freed in `sfnt_done_face'                      */

    return error;
  }